

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  cmAlphaNum local_e8;
  cmAlphaNum local_b8;
  string local_88;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string debugBuffer;
  undefined1 local_30 [8];
  string dir;
  cmFindPackageCommand *this_local;
  
  dir.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("HOME",(string *)local_30);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)local_30,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&this->Name);
    pmVar2 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,(string *)local_30,pmVar2);
  }
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"CMake User Package Registry [CMAKE_FIND_USE_PACKAGE_REGISTRY].\n"
               ,&local_61);
    std::allocator<char>::~allocator(&local_61);
    pmVar2 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &PathLabel::UserRegistry.super_PathLabel);
    anon_unknown.dwarf_516e9f::collectPathsForDebug((string *)local_60,pmVar2,0);
    cmAlphaNum::cmAlphaNum(&local_b8,&this->DebugBuffer);
    cmAlphaNum::cmAlphaNum(&local_e8,(string *)local_60);
    cmStrCat<>(&local_88,&local_b8,&local_e8);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK) {
    std::string fname = cmStrCat(dir, "/cmake/packages/", Name);
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#else
  std::string dir;
  if (cmSystemTools::GetEnv("HOME", dir)) {
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#endif
  if (this->DebugMode) {
    std::string debugBuffer =
      "CMake User Package Registry [CMAKE_FIND_USE_PACKAGE_REGISTRY].\n";
    collectPathsForDebug(debugBuffer,
                         this->LabeledPaths[PathLabel::UserRegistry]);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}